

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall groundupdb::HashedValue::operator==(HashedValue *this,HashedValue *other)

{
  bool bVar1;
  
  if ((this->m_hash == other->m_hash) && (this->m_length == other->m_length)) {
    bVar1 = std::operator==(&this->m_data,&other->m_data);
    return bVar1;
  }
  return false;
}

Assistant:

bool
HashedValue::operator==(const HashedValue& other) const
{
  if (m_hash != other.m_hash) {
    return false;
  }
  // compare hash first as generally it will be faster most often
  if (m_length != other.m_length) {
    return false;
  }
  // only do a data wise comparison if you must (highly, highly unlikely - requires hash collision)
  //return 0 == std::strcmp(m_data,other.m_data);
  return m_data == other.m_data;
}